

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  code *pcVar6;
  code *pcVar7;
  long lVar8;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  __l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  commands;
  deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_> timers
  ;
  allocator_type local_37a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_379;
  undefined4 *local_378;
  undefined8 local_370;
  undefined4 local_368;
  uint uStack_364;
  undefined5 uStack_360;
  undefined2 local_35b;
  undefined1 local_359;
  undefined4 *local_358;
  undefined8 local_350;
  undefined4 local_348;
  uint uStack_344;
  undefined2 local_33b;
  char local_339;
  undefined4 *local_338;
  undefined8 local_330;
  undefined4 local_328;
  uint uStack_324;
  undefined5 uStack_320;
  undefined2 local_31b;
  undefined1 local_319;
  undefined4 *local_318;
  undefined8 local_310;
  undefined4 local_308;
  undefined2 uStack_304;
  undefined2 uStack_302;
  undefined2 local_2fa;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8;
  undefined1 uStack_2e7;
  undefined1 uStack_2e6;
  undefined5 uStack_2e5;
  undefined4 local_2dd;
  undefined1 local_2d9;
  undefined4 *local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  uint uStack_2c4;
  undefined5 uStack_2c0;
  undefined2 local_2bb;
  undefined1 local_2b9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  local_2b8;
  t_loop local_288 [96];
  pointer local_228;
  size_type sStack_220;
  code *local_218;
  code *pcStack_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_208;
  undefined4 *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined1 local_1b4;
  undefined8 local_1b3;
  undefined2 local_1ab;
  undefined1 local_1a9;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  code *local_198;
  code *local_190;
  undefined4 *local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined1 local_174;
  undefined8 local_173;
  undefined2 local_16b;
  undefined1 local_169;
  t_loop *local_168;
  undefined8 local_160;
  code *local_158;
  code *local_150;
  undefined2 *local_148;
  undefined8 local_140;
  undefined2 local_138;
  undefined1 local_136;
  undefined4 local_12d;
  undefined1 local_129;
  t_loop *local_128;
  undefined8 local_120;
  code *local_118;
  code *local_110;
  undefined4 *local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined2 local_f4;
  undefined2 local_ea;
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  *local_e8;
  t_loop *local_e0;
  code *local_d8;
  code *local_d0;
  undefined4 *local_c8 [2];
  undefined1 local_b8 [13];
  undefined2 local_ab;
  undefined1 local_a9;
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  *local_a8;
  undefined8 local_a0;
  code *local_98 [2];
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  local_88;
  
  suisha::t_loop::t_loop(local_288);
  pcVar7 = pcStack_210;
  pcVar6 = local_218;
  local_208.first._M_dataplus._M_p = (pointer)0x0;
  local_208.first._M_string_length = 0;
  local_208.first.field_2._M_allocated_capacity._0_4_ = 0;
  local_208.first.field_2._M_allocated_capacity._4_4_ = 0;
  local_208.first.field_2._8_5_ = SUB85(pcStack_210,0);
  local_208.first.field_2._13_2_ = (undefined2)((ulong)pcStack_210 >> 0x28);
  local_208.first.field_2._M_local_buf[0xf] = (char)((ulong)pcStack_210 >> 0x38);
  if (local_218 != (code *)0x0) {
    local_208.first._M_dataplus._M_p = local_228;
    local_208.first._M_string_length = sStack_220;
    local_208.first.field_2._M_allocated_capacity._0_4_ = SUB84(local_218,0);
    local_208.first.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)local_218 >> 0x20);
    local_218 = (code *)0x0;
    pcStack_210 = (code *)0x0;
  }
  local_228 = (pointer)operator_new(0x20);
  *(undefined8 *)local_228 = 0;
  *(undefined8 *)((long)local_228 + 8) = 0;
  *(undefined8 *)((long)local_228 + 0x10) = 0;
  *(code **)((long)local_228 + 0x18) = pcVar7;
  if (pcVar6 != (code *)0x0) {
    *(pointer *)local_228 = local_208.first._M_dataplus._M_p;
    *(size_type *)((long)local_228 + 8) = local_208.first._M_string_length;
    *(code **)((long)local_228 + 0x10) = pcVar6;
  }
  sStack_220 = 0;
  local_218 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:12:16)>
              ::_M_manager;
  pcStack_210 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:12:16)>
                ::_M_invoke;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  ::_M_initialize_map(&local_88,0);
  uVar4 = uStack_2c4;
  uVar3 = uStack_324;
  uVar2 = uStack_344;
  uVar1 = uStack_364;
  local_358 = &local_348;
  uStack_344 = uStack_344 & 0xffffff00;
  local_208.first._M_dataplus._M_p = (pointer)&local_208.first.field_2;
  local_208.first.field_2._M_allocated_capacity._0_4_ = 0x74697571;
  local_208.first.field_2._M_allocated_capacity._4_4_ = uVar2 & 0xffffff00;
  local_208.first.field_2._13_2_ = local_33b;
  local_208.first.field_2._M_local_buf[0xf] = local_339;
  local_208.first._M_string_length = 4;
  local_350 = 0;
  local_348 = 0x74697500;
  local_208.second.super__Function_base._M_functor._8_8_ = 0;
  local_208.second._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:20:13)>
       ::_M_invoke;
  local_208.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:20:13)>
       ::_M_manager;
  local_378 = &local_368;
  uStack_364 = uStack_364 & 0xffffff00;
  uVar2 = uStack_364;
  local_1c8 = &local_1b8;
  local_1b8 = 0x6f686365;
  local_1b4 = 0;
  uStack_364._1_3_ = SUB43(uVar1,1);
  local_1b3 = CONCAT53(uStack_360,uStack_364._1_3_);
  local_1ab = local_35b;
  local_1a9 = local_359;
  local_1c0 = 4;
  local_370 = 0;
  local_368 = 0x6f686300;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_190 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:24:13)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:24:13)>
              ::_M_manager;
  uStack_2c4 = uStack_2c4 & 0xffffff00;
  uVar5 = uStack_2c4;
  local_188 = &local_178;
  local_178 = 0x74736f70;
  local_174 = 0;
  uStack_2c4._1_3_ = SUB43(uVar4,1);
  local_173 = CONCAT53(uStack_2c0,uStack_2c4._1_3_);
  local_16b = local_2bb;
  local_169 = local_2b9;
  local_180 = 4;
  local_2d0 = 0;
  local_2c8 = 0x74736f00;
  local_160 = 0;
  local_150 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:30:13)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:30:13)>
              ::_M_manager;
  uStack_2e7 = 0x6e;
  uStack_2e6 = 0;
  local_148 = &local_138;
  local_138 = 0x6e69;
  local_136 = 0;
  local_12d = local_2dd;
  local_129 = local_2d9;
  local_140 = 2;
  local_2f0 = 0;
  local_2e8 = 0;
  local_120 = 0;
  local_110 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:39:11)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:39:11)>
              ::_M_manager;
  uStack_304 = 0x79;
  local_108 = &local_f8;
  local_f8 = 0x72657665;
  local_f4 = 0x79;
  local_ea = local_2fa;
  local_100 = 5;
  local_310 = 0;
  local_308 = 0x72657600;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:49:14)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:49:14)>
             ::_M_manager;
  uStack_324 = uStack_324 & 0xffffff00;
  uVar1 = uStack_324;
  local_b8._0_4_ = 0x706f7473;
  local_b8[4] = 0;
  uStack_324._1_3_ = SUB43(uVar3,1);
  local_b8._5_8_ = CONCAT53(uStack_320,uStack_324._1_3_);
  local_ab = local_31b;
  local_a9 = local_319;
  local_c8[1] = (undefined4 *)0x4;
  local_330 = 0;
  local_328 = 0x706f7400;
  local_a0 = 0;
  local_98[1] = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:59:13)>
                ::_M_invoke;
  local_98[0] = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:59:13)>
                ::_M_manager;
  __l._M_len = 6;
  __l._M_array = &local_208;
  uStack_364 = uVar2;
  local_338 = &local_328;
  uStack_324 = uVar1;
  local_318 = &local_308;
  local_2f8 = &local_2e8;
  local_2d8 = &local_2c8;
  uStack_2c4 = uVar5;
  local_208.second.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)local_288;
  local_168 = local_288;
  local_128 = local_288;
  local_e8 = &local_88;
  local_e0 = local_288;
  local_c8[0] = (undefined4 *)local_b8;
  local_a8 = &local_88;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
         *)&local_2b8,__l,&local_379,&local_37a);
  lVar8 = 0;
  do {
    if (*(code **)((long)local_98 + lVar8) != (code *)0x0) {
      (**(code **)((long)local_98 + lVar8))((long)&local_a8 + lVar8,(long)&local_a8 + lVar8,3);
    }
    if ((undefined1 *)((long)local_b8 + lVar8) != *(undefined1 **)((long)local_c8 + lVar8)) {
      operator_delete(*(undefined1 **)((long)local_c8 + lVar8),*(long *)(local_b8 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x40;
  } while (lVar8 != -0x180);
  if (local_338 != &local_328) {
    operator_delete(local_338,CONCAT44(uStack_324,local_328) + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,CONCAT26(uStack_302,CONCAT24(uStack_304,local_308)) + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,
                    CONCAT53(uStack_2e5,CONCAT12(uStack_2e6,CONCAT11(uStack_2e7,local_2e8))) + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,CONCAT44(uStack_2c4,local_2c8) + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,CONCAT44(uStack_364,local_368) + 1);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,CONCAT44(uStack_344,local_348) + 1);
  }
  local_208.first._M_string_length = 0;
  local_208.first._M_dataplus._M_p = (pointer)&local_2b8;
  local_208.first.field_2._8_5_ = 0x1036a8;
  local_208.first.field_2._13_2_ = 0;
  local_208.first.field_2._M_local_buf[0xf] = '\0';
  local_208.first.field_2._M_allocated_capacity._0_4_ = 0x1037aa;
  local_208.first.field_2._M_allocated_capacity._4_4_ = 0;
  suisha::t_loop::f_poll((int)local_288,false,true,(function *)0x0);
  if ((code *)CONCAT44(local_208.first.field_2._M_allocated_capacity._4_4_,
                       local_208.first.field_2._M_allocated_capacity._0_4_) != (code *)0x0) {
    (*(code *)CONCAT44(local_208.first.field_2._M_allocated_capacity._4_4_,
                       local_208.first.field_2._M_allocated_capacity._0_4_))
              (&local_208,&local_208,3);
  }
  suisha::t_loop::f_run();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::~_Rb_tree(&local_2b8);
  std::deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>::
  ~deque((deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
          *)&local_88);
  suisha::t_loop::~t_loop(local_288);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	t_loop loop;
	loop.v_wait = [wait = std::move(loop.v_wait)]
	{
		std::cout << "before wait"sv << std::endl;
		wait();
		std::cout << "after wait"sv << std::endl;
	};
	std::deque<std::shared_ptr<t_timer>> timers;
	std::map<std::string, std::function<void()>> commands = {
		{"quit"s, [&]
		{
			loop.f_exit();
		}},
		{"echo"s, []
		{
			std::string value;
			std::cin >> value;
			std::cout << value << std::endl;
		}},
		{"post"s, [&]
		{
			std::string value;
			std::cin >> value;
			loop.f_post([value]
			{
				std::cout << "posted: "sv << value << std::endl;
			});
		}},
		{"in"s, [&]
		{
			size_t interval;
			std::string value;
			std::cin >> interval >> value;
			loop.f_timer([value]
			{
				std::cout << "single: "sv << value << std::endl;
			}, std::chrono::milliseconds(interval), true);
		}},
		{"every"s, [&]
		{
			size_t interval;
			std::string value;
			std::cin >> interval >> value;
			timers.push_back(loop.f_timer([value]
			{
				std::cout << "repeat: "sv << value << std::endl;
			}, std::chrono::milliseconds(interval)));
		}},
		{"stop"s, [&]
		{
			timers.front()->f_stop();
			timers.pop_front();
		}}
	};
	try {
		loop.f_poll(0, true, false, [&](bool a_readable, bool a_writable)
		{
			if (!a_readable) return;
			std::string command;
			std::cin >> command;
			auto i = commands.find(command);
			if (i == commands.end())
				std::cerr << "unknown command: "sv << command << std::endl;
			else
				i->second();
		});
		loop.f_run();
		return EXIT_SUCCESS;
	} catch (std::exception& e) {
		std::cerr << "Error: "sv << e.what() << std::endl;
		return EXIT_FAILURE;
	}
}